

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_ping.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint32_t packetsize;
  string addr;
  dev_ping p;
  result_t ping_result;
  
  puts("Ping device:");
  if (argc < 2) {
    display_usage();
    iVar2 = -1;
  }
  else {
    addr._M_dataplus._M_p = (pointer)&addr.field_2;
    addr._M_string_length = 0;
    addr.field_2._M_local_buf[0] = '\0';
    packetsize = 0;
    do {
      iVar2 = getopt(argc,argv,"hs:f");
      if (iVar2 == 0x66) {
        puts("\t fragmentation off by default (TODO)");
      }
      else if (iVar2 == 0x73) {
        if (_optarg != 0) {
          __isoc99_sscanf(_optarg,"%u",&packetsize);
          printf("\t packetsize %u\n",(ulong)packetsize);
        }
      }
      else {
        if (iVar2 == 0x68) {
          display_usage();
          iVar2 = 0;
          goto LAB_00103586;
        }
        printf("\t ping \'%s\'\n",argv[_optind]);
        std::__cxx11::string::assign((char *)&addr);
      }
    } while (iVar2 != -1);
    if (addr._M_string_length == 0) {
      iVar2 = -2;
    }
    else {
      dev_ping::dev_ping(&p);
      ping_result.from_addr._M_dataplus._M_p = (pointer)&ping_result.from_addr.field_2;
      ping_result.from_addr._M_string_length = 0;
      ping_result.from_addr.field_2._M_local_buf[0] = '\0';
      ping_result.status._M_dataplus._M_p = (pointer)&ping_result.status.field_2;
      ping_result.status._M_string_length = 0;
      ping_result.status.field_2._M_local_buf[0] = '\0';
      if (packetsize != 0) {
        dev_ping::setSize(&p,(uint16_t)packetsize);
      }
      bVar1 = dev_ping::check(&p,&addr,&ping_result);
      pcVar3 = "fail";
      if (bVar1) {
        pcVar3 = "ok";
      }
      iVar2 = 0;
      printf("Ping: %s\n",pcVar3);
      printf("%s",ping_result.status._M_dataplus._M_p);
      dev_ping::result_s::~result_s(&ping_result);
      dev_ping::~dev_ping(&p);
    }
LAB_00103586:
    std::__cxx11::string::~string((string *)&addr);
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
//    setbuf(stdout, NULL); // TODO: remove, need only for debug on cross gdb
    printf("Ping device:\n");

    if (argc < 2) {
        display_usage();
        return -1;
    }
    const char *short_options = {"hs:f"}; // x: - mean x have parametr

    std::string addr;
    uint32_t packetsize = 0;
    bool fragmentation = false;

    int opt;
    do {
        opt = getopt(argc, argv, short_options);
        switch (opt) {
            case 'h': {
                display_usage();
                return 0;
            } break;

            case 's': {
                if (optarg) {
                    sscanf(optarg, "%u", &packetsize);
                    printf("\t packetsize %u\n", packetsize);
                }
            } break;

            case 'f': {
                printf("\t fragmentation off by default (TODO)\n");
            } break;

            default: {
                printf("\t ping '%s'\n", argv[optind]);
                addr.assign(argv[optind]);
            } break;
        }
    } while (opt != -1);

    if (addr.empty()) return -2;

    dev_ping p;
    dev_ping::result_t ping_result;
    if (packetsize) p.setSize(packetsize);
    bool ok = p.check(addr, &ping_result);
    printf("Ping: %s\n", ok ? "ok" : "fail");
    printf("%s", ping_result.status.c_str());

    return 0;
}